

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleTypeHandler<2UL>::IsObjTypeSpecEquivalent
          (SimpleTypeHandler<2UL> *this,Type *type,TypeEquivalenceRecord *record,
          uint *failedPropertyIndex)

{
  EquivalentPropertyEntry *pEVar1;
  bool bVar2;
  EquivalentPropertyEntry *refInfo;
  uint pi;
  EquivalentPropertyEntry *properties;
  uint *failedPropertyIndex_local;
  TypeEquivalenceRecord *record_local;
  Type *type_local;
  SimpleTypeHandler<2UL> *this_local;
  
  pEVar1 = record->properties;
  refInfo._4_4_ = 0;
  while( true ) {
    if (record->propertyCount <= refInfo._4_4_) {
      return true;
    }
    bVar2 = IsObjTypeSpecEquivalent(this,type,pEVar1 + refInfo._4_4_);
    if (!bVar2) break;
    refInfo._4_4_ = refInfo._4_4_ + 1;
  }
  *failedPropertyIndex = refInfo._4_4_;
  return false;
}

Assistant:

bool SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        Js::EquivalentPropertyEntry* properties = record.properties;
        for (uint pi = 0; pi < record.propertyCount; pi++)
        {
            const EquivalentPropertyEntry* refInfo = &properties[pi];
            if (!this->SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(type, refInfo))
            {
                failedPropertyIndex = pi;
                return false;
            }
        }

        return true;
    }